

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264d_vdpu_com.c
# Opt level: O0

MPP_RET adjust_input(H264dVdpuPriv_t *priv,DXVA_Slice_H264_Long *p_long,DXVA_PicParams_H264_MVC *pp)

{
  uint uVar1;
  bool bVar2;
  ulong uVar3;
  H264dVdpuRefPicInfo_t *p;
  H264dVdpuDpbInfo_t *new_dpb_1;
  RK_U32 j_1;
  RK_U32 i_1;
  H264dVdpuDpbInfo_t *old_dpb;
  H264dVdpuDpbInfo_t *new_dpb;
  RK_U32 find_flag;
  RK_U32 j;
  RK_U32 i;
  MPP_RET ret;
  DXVA_PicParams_H264_MVC *pp_local;
  DXVA_Slice_H264_Long *p_long_local;
  H264dVdpuPriv_t *priv_local;
  
  get_info_input(priv,p_long,pp);
  uVar1 = priv->layed_id;
  for (find_flag = 0; find_flag < 0x10; find_flag = find_flag + 1) {
    bVar2 = false;
    if (priv->old_dpb[uVar1][find_flag].valid != '\0') {
      for (new_dpb._4_4_ = 0; new_dpb._4_4_ < 0x10; new_dpb._4_4_ = new_dpb._4_4_ + 1) {
        if (priv->new_dpb[new_dpb._4_4_].valid != '\0') {
          bVar2 = priv->old_dpb[uVar1][find_flag].slot_index ==
                  priv->new_dpb[new_dpb._4_4_].slot_index &&
                  priv->old_dpb[uVar1][find_flag].frame_num ==
                  priv->new_dpb[new_dpb._4_4_].frame_num;
          if ((priv->new_dpb[new_dpb._4_4_].top_used != 0) &&
             (priv->old_dpb[uVar1][find_flag].top_used != 0)) {
            bVar2 = priv->old_dpb[uVar1][find_flag].top_poc == priv->new_dpb[new_dpb._4_4_].top_poc
                    && bVar2;
          }
          if (((priv->new_dpb[new_dpb._4_4_].bot_used != 0) &&
              (priv->old_dpb[uVar1][find_flag].bot_used != 0)) &&
             (priv->old_dpb[uVar1][find_flag].bot_poc != priv->new_dpb[new_dpb._4_4_].bot_poc)) {
            bVar2 = false;
          }
          if (bVar2) {
            priv->new_dpb[new_dpb._4_4_].have_same = '\x01';
            priv->new_dpb[new_dpb._4_4_].new_dpb_idx = find_flag;
            memcpy(priv->old_dpb[uVar1] + find_flag,priv->new_dpb + new_dpb._4_4_,0x44);
            break;
          }
        }
      }
    }
    if (!bVar2) {
      memset(priv->old_dpb[uVar1] + find_flag,0,0x44);
    }
  }
  for (new_dpb._4_4_ = 0; new_dpb._4_4_ < 0x10; new_dpb._4_4_ = new_dpb._4_4_ + 1) {
    if ((priv->new_dpb[new_dpb._4_4_].valid != '\0') &&
       (priv->new_dpb[new_dpb._4_4_].have_same == '\0')) {
      for (find_flag = 0; find_flag < 0x10; find_flag = find_flag + 1) {
        if (priv->old_dpb[uVar1][find_flag].valid == '\0') {
          memcpy(priv->old_dpb[uVar1] + find_flag,priv->new_dpb + new_dpb._4_4_,0x44);
          priv->new_dpb[new_dpb._4_4_].new_dpb_idx = find_flag;
          break;
        }
      }
    }
  }
  priv->ilt_dpb = (H264dVdpuDpbInfo_t *)0x0;
  if (priv->layed_id != 0) {
    for (find_flag = 0; find_flag < 0x10; find_flag = find_flag + 1) {
      if ((priv->old_dpb[uVar1][find_flag].valid == '\0') &&
         (priv->old_dpb[uVar1][find_flag].is_ilt_flag != 0)) {
        priv->ilt_dpb = priv->old_dpb[uVar1] + find_flag;
        break;
      }
    }
  }
  for (new_dpb_1._0_4_ = 0; (uint)new_dpb_1 < 3; new_dpb_1._0_4_ = (uint)new_dpb_1 + 1) {
    uVar3 = (ulong)(uint)new_dpb_1;
    for (new_dpb_1._4_4_ = 0; new_dpb_1._4_4_ < 0x20; new_dpb_1._4_4_ = new_dpb_1._4_4_ + 1) {
      if (priv->refinfo[uVar3][new_dpb_1._4_4_].valid != 0) {
        priv->refinfo[uVar3][new_dpb_1._4_4_].dpb_idx =
             priv->new_dpb[priv->refinfo[uVar3][new_dpb_1._4_4_].dpb_idx].new_dpb_idx;
      }
    }
  }
  refill_info_input(priv,p_long,pp);
  return MPP_OK;
}

Assistant:

MPP_RET adjust_input(H264dVdpuPriv_t *priv,
                     DXVA_Slice_H264_Long *p_long,
                     DXVA_PicParams_H264_MVC  *pp)
{
    MPP_RET ret = MPP_ERR_UNKNOW;

    get_info_input(priv, p_long, pp);
    //!< dpb mapping to new order
    {
        RK_U32 i = 0, j = 0;
        RK_U32 find_flag = 0;
        H264dVdpuDpbInfo_t *new_dpb = priv->new_dpb;
        H264dVdpuDpbInfo_t *old_dpb = priv->old_dpb[priv->layed_id];

#if DEBUG_REF_LIST
        {
            mpp_log("=== frame_num %d ===\n", pp->frame_num);
            for (i = 0; i < MPP_ARRAY_ELEMS(priv->old_dpb[priv->layed_id]); i++) {
                mpp_log("old_dpb[%d] frame_num=%d field=%d poc0=%d poc1=%d\n",
                        i, old_dpb[i].frame_num, old_dpb[i].field_flag, old_dpb[i].top_poc, old_dpb[i].bot_poc);
            }
            for (i = 0; i < MPP_ARRAY_ELEMS(priv->old_dpb[priv->layed_id]); i++) {
                mpp_log("new_dpb[%d] frame_num=%d field=%d poc0=%d poc1=%d\n",
                        i, new_dpb[i].frame_num, new_dpb[i].field_flag, new_dpb[i].top_poc, new_dpb[i].bot_poc);
            }
        }
#endif
        //!< delete old dpb
        for (i = 0; i < MPP_ARRAY_ELEMS(priv->old_dpb[priv->layed_id]); i++) {
            find_flag = 0;
            if (old_dpb[i].valid) {
                for (j = 0; j < MPP_ARRAY_ELEMS(priv->new_dpb); j++) {
                    if (new_dpb[j].valid) {
                        find_flag =
                            ((old_dpb[i].frame_num == new_dpb[j].frame_num)
                             ? 1 : 0);
                        find_flag = ((old_dpb[i].slot_index
                                      == new_dpb[j].slot_index)
                                     ? find_flag : 0);
                        if (new_dpb[j].top_used && old_dpb[i].top_used) {
                            find_flag =
                                ((old_dpb[i].top_poc == new_dpb[j].top_poc)
                                 ? find_flag : 0);
                        }
                        if (new_dpb[j].bot_used && old_dpb[i].bot_used) {
                            find_flag  =
                                ((old_dpb[i].bot_poc == new_dpb[j].bot_poc)
                                 ? find_flag : 0);
                        }
                        if (find_flag) { //!< found
                            new_dpb[j].have_same = 1;
                            new_dpb[j].new_dpb_idx = i;
                            old_dpb[i] = new_dpb[j];
                            break;
                        }
                    }
                }
            }
            //!< not found
            if (find_flag == 0) {
                memset(&old_dpb[i], 0, sizeof(old_dpb[i]));
            }
        }
        //!< add new dpb
        for (j = 0; j < MPP_ARRAY_ELEMS(priv->new_dpb); j++) {
            if ((new_dpb[j].valid == 0) || new_dpb[j].have_same) {
                continue;
            }
            for (i = 0; i < MPP_ARRAY_ELEMS(priv->old_dpb[priv->layed_id]); i++) {
                if (old_dpb[i].valid == 0) {
                    old_dpb[i] = new_dpb[j];
                    new_dpb[j].new_dpb_idx = i;
                    break;
                }
            }
        }
        //!< inter-layer reference
        priv->ilt_dpb = NULL;
        if (priv->layed_id) {
            for (i = 0; i < MPP_ARRAY_ELEMS(priv->old_dpb[1]); i++) {
                if ((old_dpb[i].valid == 0) && old_dpb[i].is_ilt_flag) {
                    priv->ilt_dpb = &old_dpb[i];
                    break;
                }
            }
        }
    }
    //!< addjust ref_dpb
    {
        RK_U32 i = 0, j = 0;
        H264dVdpuDpbInfo_t *new_dpb = priv->new_dpb;

        for (j = 0; j < 3; j++) {
            H264dVdpuRefPicInfo_t *p = priv->refinfo[j];
            for (i = 0; i < MPP_ARRAY_ELEMS(priv->refinfo[j]); i++) {
                if (p[i].valid) {
                    p[i].dpb_idx = new_dpb[p[i].dpb_idx].new_dpb_idx;
                }
            }
        }
    }
    refill_info_input(priv, p_long, pp);

    return ret = MPP_OK;
}